

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControlPrivate::cursorMoveKeyEvent(QWidgetTextControlPrivate *this,QKeyEvent *e)

{
  QTextCursor *cursor;
  QObject *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  StandardKey SVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QTextLine QVar7;
  QTextCursor oldSelection;
  MoveMode local_6c;
  bool local_68;
  undefined1 *local_60 [3];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  cursor = &this->cursor;
  cVar2 = QTextCursor::isNull();
  if (cVar2 != '\0') {
    bVar6 = false;
    goto LAB_004c5053;
  }
  local_60[0] = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)local_60,cursor);
  iVar3 = QTextCursor::position();
  if (e == (QKeyEvent *)0x0) {
LAB_004c5046:
    iVar4 = 0;
  }
  else {
    SVar5 = (StandardKey)e;
    cVar2 = QKeyEvent::matches(SVar5);
    if (cVar2 == '\0') {
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 9;
        goto LAB_004c4ccd;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      local_6c = 0x13;
      cVar2 = QKeyEvent::matches(SVar5);
      iVar4 = 1;
      local_68 = true;
      if (cVar2 != '\0') goto LAB_004c4cd0;
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 9;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      local_6c = 0x14;
      if (cVar2 != '\0') goto LAB_004c4cd0;
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 10;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 3;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 0xd;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 4;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 0xf;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      iVar4 = 1;
      if (cVar2 != '\0') {
        local_6c = KeepAnchor;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_6c = 0xb;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::block();
        QVar7 = currentTextLine(cursor);
        QTextBlock::previous();
        cVar2 = QTextBlock::isValid();
        if (QVar7.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
          local_6c = 2;
        }
        else {
          local_6c = 2 - (QVar7.index == 0);
        }
LAB_004c518f:
        iVar4 = 1;
        goto LAB_004c4cd0;
      }
      if (e == (QKeyEvent *)0x0) goto LAB_004c5046;
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::block();
        QVar7 = currentTextLine(cursor);
        QTextBlock::next();
        cVar2 = QTextBlock::isValid();
        if (QVar7.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
          local_6c = 0xc;
        }
        else {
          QTextBlock::layout();
          iVar4 = QTextLayout::lineCount();
          local_6c = (QVar7.index != iVar4 + -1) + 0xb;
        }
        goto LAB_004c518f;
      }
      iVar4 = 0;
      if (e != (QKeyEvent *)0x0) {
        cVar2 = QKeyEvent::matches(SVar5);
        local_68 = false;
        if (cVar2 != '\0') goto LAB_004c4cd0;
        iVar4 = 0;
        if (e != (QKeyEvent *)0x0) {
          cVar2 = QKeyEvent::matches(SVar5);
          local_6c = 10;
          local_68 = false;
          if (cVar2 != '\0') goto LAB_004c4cd0;
          iVar4 = 0;
          if (e != (QKeyEvent *)0x0) {
            cVar2 = QKeyEvent::matches(SVar5);
            local_6c = 0xf;
            local_68 = false;
            if (cVar2 != '\0') goto LAB_004c4cd0;
            iVar4 = 0;
            if (e != (QKeyEvent *)0x0) {
              cVar2 = QKeyEvent::matches(SVar5);
              local_6c = 4;
              local_68 = false;
              if (cVar2 != '\0') goto LAB_004c4cd0;
              iVar4 = 0;
              if (e != (QKeyEvent *)0x0) {
                cVar2 = QKeyEvent::matches(SVar5);
                if (cVar2 != '\0') {
                  local_6c = 0xc;
LAB_004c51bf:
                  iVar4 = 0;
                  local_68 = false;
                  goto LAB_004c4cd0;
                }
                iVar4 = 0;
                if (e != (QKeyEvent *)0x0) {
                  cVar2 = QKeyEvent::matches(SVar5);
                  if (cVar2 != '\0') {
                    local_6c = 2;
                    goto LAB_004c51bf;
                  }
                  iVar4 = 0;
                  if (e != (QKeyEvent *)0x0) {
                    cVar2 = QKeyEvent::matches(SVar5);
                    local_6c = 3;
                    local_68 = false;
                    if (cVar2 != '\0') goto LAB_004c4cd0;
                    iVar4 = 0;
                    if (e != (QKeyEvent *)0x0) {
                      cVar2 = QKeyEvent::matches(SVar5);
                      local_6c = 0xd;
                      local_68 = false;
                      if (cVar2 != '\0') goto LAB_004c4cd0;
                      iVar4 = 0;
                      if (e != (QKeyEvent *)0x0) {
                        cVar2 = QKeyEvent::matches(SVar5);
                        local_6c = KeepAnchor;
                        local_68 = false;
                        if (cVar2 != '\0') goto LAB_004c4cd0;
                        iVar4 = 0;
                        if (e != (QKeyEvent *)0x0) {
                          cVar2 = QKeyEvent::matches(SVar5);
                          local_6c = 0xb;
                          local_68 = false;
                          if (cVar2 != '\0') goto LAB_004c4cd0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_6c = 0x13;
LAB_004c4ccd:
      local_68 = false;
      iVar4 = 0;
LAB_004c4cd0:
      QTextCursor::visualNavigation();
      QTextCursor::setVisualNavigation(SUB81(cursor,0));
      cVar2 = QTextCursor::movePosition((MoveOperation)cursor,local_6c,iVar4);
      QTextCursor::setVisualNavigation(SUB81(cursor,0));
      (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1);
      if (cVar2 == '\0') {
        if ((*(int *)(e + 0x40) + 0xfeffffeeU < 4) && (this->ignoreUnusedNavigationEvents != false))
        {
          iVar3 = QTextCursor::anchor();
          iVar4 = QTextCursor::anchor();
          if (iVar3 == iVar4) goto LAB_004c5046;
        }
      }
      else {
        iVar4 = QTextCursor::position();
        if (iVar4 != iVar3) {
          QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,6,(void **)0x0);
        }
        QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
      }
      selectionChanged(this,local_68);
      repaintOldAndNewSelection(this,(QTextCursor *)local_60);
      iVar4 = 1;
    }
  }
  bVar6 = SUB41(iVar4,0);
  QTextCursor::~QTextCursor((QTextCursor *)local_60);
LAB_004c5053:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QWidgetTextControlPrivate::cursorMoveKeyEvent(QKeyEvent *e)
{
#ifdef QT_NO_SHORTCUT
    Q_UNUSED(e);
#endif

    Q_Q(QWidgetTextControl);
    if (cursor.isNull())
        return false;

    const QTextCursor oldSelection = cursor;
    const int oldCursorPos = cursor.position();

    QTextCursor::MoveMode mode = QTextCursor::MoveAnchor;
    QTextCursor::MoveOperation op = QTextCursor::NoMove;

    if (false) {
    }
#ifndef QT_NO_SHORTCUT
    if (e == QKeySequence::MoveToNextChar) {
            op = QTextCursor::Right;
    }
    else if (e == QKeySequence::MoveToPreviousChar) {
            op = QTextCursor::Left;
    }
    else if (e == QKeySequence::SelectNextChar) {
           op = QTextCursor::Right;
           mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousChar) {
            op = QTextCursor::Left;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectNextWord) {
            op = QTextCursor::WordRight;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousWord) {
            op = QTextCursor::WordLeft;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfLine) {
            op = QTextCursor::StartOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfLine) {
            op = QTextCursor::EndOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfBlock) {
            op = QTextCursor::StartOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfBlock) {
            op = QTextCursor::EndOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfDocument) {
            op = QTextCursor::Start;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfDocument) {
            op = QTextCursor::End;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousLine) {
            op = QTextCursor::Up;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.previous().isValid()
                    && line.isValid()
                    && line.lineNumber() == 0)
                    op = QTextCursor::Start;
            }
    }
    else if (e == QKeySequence::SelectNextLine) {
            op = QTextCursor::Down;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.next().isValid()
                    && line.isValid()
                    && line.lineNumber() == block.layout()->lineCount() - 1)
                    op = QTextCursor::End;
            }
    }
    else if (e == QKeySequence::MoveToNextWord) {
            op = QTextCursor::WordRight;
    }
    else if (e == QKeySequence::MoveToPreviousWord) {
            op = QTextCursor::WordLeft;
    }
    else if (e == QKeySequence::MoveToEndOfBlock) {
            op = QTextCursor::EndOfBlock;
    }
    else if (e == QKeySequence::MoveToStartOfBlock) {
            op = QTextCursor::StartOfBlock;
    }
    else if (e == QKeySequence::MoveToNextLine) {
            op = QTextCursor::Down;
    }
    else if (e == QKeySequence::MoveToPreviousLine) {
            op = QTextCursor::Up;
    }
    else if (e == QKeySequence::MoveToStartOfLine) {
            op = QTextCursor::StartOfLine;
    }
    else if (e == QKeySequence::MoveToEndOfLine) {
            op = QTextCursor::EndOfLine;
    }
    else if (e == QKeySequence::MoveToStartOfDocument) {
            op = QTextCursor::Start;
    }
    else if (e == QKeySequence::MoveToEndOfDocument) {
            op = QTextCursor::End;
    }
#endif // QT_NO_SHORTCUT
    else {
        return false;
    }

// Except for pageup and pagedown, OS X has very different behavior, we don't do it all, but
// here's the breakdown:
// Shift still works as an anchor, but only one of the other keys can be down Ctrl (Command),
// Alt (Option), or Meta (Control).
// Command/Control + Left/Right -- Move to left or right of the line
//                 + Up/Down -- Move to top bottom of the file. (Control doesn't move the cursor)
// Option + Left/Right -- Move one word Left/right.
//        + Up/Down  -- Begin/End of Paragraph.
// Home/End Top/Bottom of file. (usually don't move the cursor, but will select)

    bool visualNavigation = cursor.visualNavigation();
    cursor.setVisualNavigation(true);
    const bool moved = cursor.movePosition(op, mode);
    cursor.setVisualNavigation(visualNavigation);
    q->ensureCursorVisible();

    bool ignoreNavigationEvents = ignoreUnusedNavigationEvents;
    bool isNavigationEvent = e->key() == Qt::Key_Up || e->key() == Qt::Key_Down;

#ifdef QT_KEYPAD_NAVIGATION
    ignoreNavigationEvents = ignoreNavigationEvents || QApplicationPrivate::keypadNavigationEnabled();
    isNavigationEvent = isNavigationEvent ||
                        (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                         && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right));
#else
    isNavigationEvent = isNavigationEvent || e->key() == Qt::Key_Left || e->key() == Qt::Key_Right;
#endif

    if (moved) {
        if (cursor.position() != oldCursorPos)
            emit q->cursorPositionChanged();
        emit q->microFocusChanged();
    } else if (ignoreNavigationEvents && isNavigationEvent && oldSelection.anchor() == cursor.anchor()) {
        return false;
    }

    selectionChanged(/*forceEmitSelectionChanged =*/(mode == QTextCursor::KeepAnchor));

    repaintOldAndNewSelection(oldSelection);

    return true;
}